

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginGlobalInitExpr(BinaryReaderIR *this,Index index)

{
  pointer ppGVar1;
  Result RVar2;
  
  ppGVar1 = (this->module_->globals).
            super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((long)(this->module_->globals).
             super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3) - 1U == (ulong)index) {
    RVar2 = BeginInitExpr(this,&ppGVar1[index]->init_expr);
    return (Result)RVar2.enum_;
  }
  __assert_fail("index == module_->globals.size() - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-reader-ir.cc"
                ,0x2ef,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::BeginGlobalInitExpr(Index)"
               );
}

Assistant:

Result BinaryReaderIR::BeginGlobalInitExpr(Index index) {
  assert(index == module_->globals.size() - 1);
  Global* global = module_->globals[index];
  return BeginInitExpr(&global->init_expr);
}